

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_send_http_error(mg_connection *conn,int status,char *fmt,...)

{
  char cVar1;
  _func_int_mg_connection_ptr_int_char_ptr *p_Var2;
  char in_AL;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  ptrdiff_t pVar8;
  int *piVar9;
  undefined8 in_RCX;
  mg_file *filep;
  mg_file_stat *extraout_RDX;
  mg_file_stat *filep_00;
  mg_file_stat *extraout_RDX_00;
  time_t *t;
  undefined8 in_R8;
  char *pcVar10;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int truncated;
  va_list ap;
  va_list ap_1;
  char date [64];
  char path_buf [4096];
  char errmsg_buf [8192];
  int local_31c4;
  char *local_31c0;
  ulong local_31b8;
  char *local_31b0;
  ulong local_31a8;
  time_t local_31a0;
  mg_file local_3198;
  undefined8 local_3168;
  undefined1 *puStack_3160;
  undefined1 *local_3158;
  __va_list_tag local_3148;
  char local_3128 [64];
  undefined1 local_30e8 [24];
  undefined8 local_30d0;
  undefined8 local_30c8;
  undefined8 local_30c0;
  undefined4 local_30b8;
  undefined8 local_30a8;
  undefined8 local_3098;
  undefined8 local_3088;
  undefined8 local_3078;
  undefined8 local_3068;
  undefined8 local_3058;
  undefined8 local_3048;
  char acStack_3039 [4065];
  undefined1 local_2058;
  char local_2038 [8200];
  
  local_3158 = local_30e8;
  if (in_AL != '\0') {
    local_30b8 = in_XMM0_Da;
    local_30a8 = in_XMM1_Qa;
    local_3098 = in_XMM2_Qa;
    local_3088 = in_XMM3_Qa;
    local_3078 = in_XMM4_Qa;
    local_3068 = in_XMM5_Qa;
    local_3058 = in_XMM6_Qa;
    local_3048 = in_XMM7_Qa;
  }
  puStack_3160 = &stack0x00000008;
  local_3168 = 0x3000000018;
  local_3198.stat.is_directory = 0;
  local_3198.stat.is_gzipped = 0;
  local_3198.stat.location = 0;
  local_3198.stat._28_4_ = 0;
  local_3198.stat.size = 0;
  local_3198.stat.last_modified = 0;
  local_3198.access.fp = (FILE *)0x0;
  if (fmt == (char *)0x0 || conn == (mg_connection *)0x0) {
    return -2;
  }
  conn->status_code = status;
  local_30d0 = in_RCX;
  local_30c8 = in_R8;
  local_30c0 = in_R9;
  if (((status < 200) || (status == 0x130)) || (status == 0xcc)) {
    if (conn->in_error_handler != 0) goto LAB_0011b3f8;
    if ((conn->phys_ctx->callbacks).http_error != (_func_int_mg_connection_ptr_int_char_ptr *)0x0)
    goto LAB_0011b1c8;
  }
  else {
LAB_0011b1c8:
    local_3148.gp_offset = 0x18;
    local_3148.fp_offset = 0x30;
    local_3148.overflow_arg_area = puStack_3160;
    local_3148.reg_save_area = local_3158;
    mg_vsnprintf(conn,(int *)0x0,local_2038,0x2000,fmt,&local_3148);
    if (conn->in_error_handler != 0) goto LAB_0011b3f8;
  }
  p_Var2 = (conn->phys_ctx->callbacks).http_error;
  if (p_Var2 == (_func_int_mg_connection_ptr_int_char_ptr *)0x0) {
    if (conn->in_error_handler != 0) goto LAB_0011b3f8;
  }
  else {
    conn->in_error_handler = 1;
    iVar3 = (*p_Var2)(conn,status,local_2038);
    conn->in_error_handler = 0;
    if (iVar3 == 0) {
      return 0;
    }
  }
  local_31c0 = conn->dom_ctx->config[0x37];
  if (local_31c0 != (char *)0x0) {
    local_31b0 = conn->dom_ctx->config[0x24];
    local_31b8 = (ulong)(uint)(status / 100);
    uVar5 = 1;
    do {
      if ((int)uVar5 == 2) {
        pcVar10 = "%serror%01uxx.";
      }
      else if ((int)uVar5 == 1) {
        pcVar10 = "%serror%03u.";
      }
      else {
        pcVar10 = "%serror.";
      }
      local_31a8 = uVar5;
      mg_snprintf(conn,&local_31c4,(char *)((long)acStack_3039 + 1),0xfe0,pcVar10,local_31c0);
      local_2058 = 0;
      pcVar10 = strchr(local_31b0,0x2e);
      if (pcVar10 != (char *)0x0) {
        sVar6 = strlen((char *)((long)acStack_3039 + 1));
        iVar4 = (int)sVar6;
        iVar3 = 0xfe0;
        if (iVar4 < 0xfe0) {
          iVar3 = iVar4;
        }
        lVar7 = (long)iVar4;
        filep = (mg_file *)0xfe0;
        filep_00 = extraout_RDX;
        if (0xfdf < lVar7) {
          lVar7 = 0xfe0;
        }
        do {
          uVar5 = 1;
          do {
            cVar1 = pcVar10[uVar5];
            if ((cVar1 == '\0') || (cVar1 == ',')) goto LAB_0011b3a4;
            acStack_3039[uVar5 + lVar7] = cVar1;
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x20);
          uVar5 = 0x20;
LAB_0011b3a4:
          acStack_3039[(long)(iVar3 + -1 + (int)uVar5) + 1] = 0;
          iVar4 = mg_stat((mg_connection *)((long)acStack_3039 + 1),(char *)&local_3198,filep_00);
          if (iVar4 != 0) {
            conn->in_error_handler = 1;
            if (conn->dom_ctx != (mg_domain_context *)0x0) {
              pVar8 = match_prefix_strlen(conn->dom_ctx->config[0x20],
                                          (char *)((long)acStack_3039 + 1));
              if (pVar8 < 1) {
                handle_static_file_request
                          (conn,(char *)((long)acStack_3039 + 1),&local_3198,(char *)0x0,(char *)0x0
                          );
              }
              else {
                local_31a0 = time((time_t *)0x0);
                iVar3 = mg_fopen((mg_connection *)((long)acStack_3039 + 1),(char *)0x1,
                                 (int)&local_3198,filep);
                if (iVar3 == 0) {
                  piVar9 = __errno_location();
                  pcVar10 = strerror(*piVar9);
                  mg_send_http_error(conn,500,"Error: Cannot read file\nfopen(%s): %s",
                                     (long)acStack_3039 + 1,pcVar10);
                }
                else {
                  conn->must_close = 1;
                  gmt_time_string(local_3128,(size_t)&local_31a0,t);
                  fclose_on_exec(&local_3198.access,conn);
                  mg_response_header_start(conn,200);
                  send_no_cache_header(conn);
                  pcVar10 = conn->dom_ctx->config[0x38];
                  if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
                    mg_response_header_add_lines(conn,pcVar10);
                  }
                  send_cors_header(conn);
                  mg_response_header_add(conn,"Content-Type","text/html",-1);
                  mg_response_header_send(conn);
                  send_ssi_file(conn,(char *)((long)acStack_3039 + 1),&local_3198,0);
                  if ((FILE *)local_3198.access.fp != (FILE *)0x0) {
                    fclose((FILE *)local_3198.access.fp);
                  }
                }
              }
            }
            conn->in_error_handler = 0;
            return 0;
          }
          pcVar10 = strchr(pcVar10 + (uVar5 & 0xffffffff),0x2e);
          filep_00 = extraout_RDX_00;
        } while (pcVar10 != (char *)0x0);
      }
      uVar5 = (ulong)((uint)local_31a8 + 1);
    } while ((uint)local_31a8 < 3);
  }
LAB_0011b3f8:
  conn->must_close = 1;
  mg_response_header_start(conn,status);
  send_no_cache_header(conn);
  pcVar10 = conn->dom_ctx->config[0x38];
  if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
    mg_response_header_add_lines(conn,pcVar10);
  }
  send_cors_header(conn);
  if (status < 200) {
    mg_response_header_send(conn);
    return 0;
  }
  if ((status != 0xcc) && (status != 0x130)) {
    mg_response_header_add(conn,"Content-Type","text/plain; charset=utf-8",-1);
  }
  mg_response_header_send(conn);
  if (status != 0xcc) {
    if (status != 0x130) {
      pcVar10 = mg_get_response_code_text(conn,status);
      mg_printf(conn,"Error %d: %s\n",status,pcVar10);
      sVar6 = strlen(local_2038);
      mg_write(conn,local_2038,sVar6);
      return 0;
    }
    return 0;
  }
  return 0;
}

Assistant:

CIVETWEB_API int
mg_send_http_error(struct mg_connection *conn, int status, const char *fmt, ...)
{
	va_list ap;
	int ret;

	va_start(ap, fmt);
	ret = mg_send_http_error_impl(conn, status, fmt, ap);
	va_end(ap);

	return ret;
}